

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O2

void verb_prog_ilopheth_bush(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  ROOM_INDEX_DATA *pRoomIndex;
  
  if (ch->fighting != (CHAR_DATA *)0x0) {
    send_to_char("You\'re otherwise occupied right now.\n\r",ch);
    return;
  }
  send_to_char("With a mighty effort, you duck your head and push through the bushes to the west.\n\r"
               ,ch);
  act("With a mighty effort, $n ducks $s head and pushes through the bushes to the west.",ch,
      (void *)0x0,(void *)0x0,0);
  pRoomIndex = get_room_index(0x2388);
  char_from_room(ch);
  char_to_room(ch,pRoomIndex);
  do_look(ch,"auto");
  WAIT_STATE(ch,0x18);
  return;
}

Assistant:

void verb_prog_ilopheth_bush(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *room;

	if (ch->fighting)
	{
		send_to_char("You're otherwise occupied right now.\n\r", ch);
		return;
	}

	send_to_char("With a mighty effort, you duck your head and push through the bushes to the west.\n\r", ch);
	act("With a mighty effort, $n ducks $s head and pushes through the bushes to the west.", ch, 0, 0, TO_ROOM);

	room = get_room_index(9096);

	char_from_room(ch);
	char_to_room(ch, room);
	do_look(ch, "auto");

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}